

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_SimpleEmptyKey::_Run(_Test_SimpleEmptyKey *this)

{
  int iVar1;
  long lVar2;
  Random rnd;
  allocator local_76;
  allocator local_75;
  Random local_74;
  string local_70;
  string local_50;
  
  for (lVar2 = 0; lVar2 != 0xc0; lVar2 = lVar2 + 0xc) {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + lVar2));
    iVar1 = test::RandomSeed();
    local_74.seed_ = iVar1 + 1U & 0x7fffffff;
    if ((local_74.seed_ == 0x7fffffff) || (local_74.seed_ == 0)) {
      local_74.seed_ = 1;
    }
    std::__cxx11::string::string((string *)&local_50,"",&local_75);
    std::__cxx11::string::string((string *)&local_70,"v",&local_76);
    Harness::Add(&this->super_Harness,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    Harness::Test(&this->super_Harness,&local_74);
  }
  return;
}

Assistant:

TEST(Harness, SimpleEmptyKey) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 1);
    Add("", "v");
    Test(&rnd);
  }
}